

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O2

char * pkg_writeCharList(FileStream *s,CharList *l,char *delim,int32_t quote)

{
  size_t sVar1;
  char *__s;
  CharList *pCVar2;
  undefined8 uStack_440;
  char buffer [1024];
  
  do {
    pCVar2 = l;
    if (pCVar2 == (CharList *)0x0) {
      return (char *)0x0;
    }
    if (pCVar2->str != (char *)0x0) {
      uStack_440 = (code *)0x1f0569;
      strncpy(buffer,pCVar2->str,0x3ff);
      buffer[0x3ff] = '\0';
      __s = pCVar2->str;
      uStack_440 = (code *)0x1f057d;
      sVar1 = strlen(__s);
      if (0x3fe < sVar1) {
        uStack_440 = (code *)0x1f0675;
        fprintf(_stderr,"%s:%d: Internal error, line too long (greater than 1023 chars)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/pkgdata/pkgtypes.c"
                ,0x57);
        uStack_440 = pkg_countCharList;
        exit(0);
      }
      if (quote < 0) {
        uStack_440 = (code *)0x1f05d4;
        sVar1 = strlen(buffer);
        if (buffer[sVar1 - 1] == '\"') {
          buffer[sVar1 - 1] = '\0';
        }
        if (buffer[0] == '\"') {
          uStack_440 = (code *)0x1f05f4;
          strcpy(buffer,buffer + 1);
        }
      }
      else if (quote != 0) {
        if (*__s != '\"') {
          buffer[0] = '\"';
          buffer[1] = '\0';
          uStack_440 = (code *)0x1f05a9;
          strcat(buffer,pCVar2->str);
          __s = pCVar2->str;
        }
        uStack_440 = (code *)0x1f05b5;
        sVar1 = strlen(__s);
        if (__s[sVar1 - 1] != '\"') {
          uStack_440 = (code *)0x1f05c4;
          sVar1 = strlen(buffer);
          (buffer + sVar1)[0] = '\"';
          (buffer + sVar1)[1] = '\0';
        }
      }
      uStack_440 = (code *)0x1f05fc;
      sVar1 = strlen(buffer);
      uStack_440 = (code *)0x1f0609;
      T_FileStream_write(s,buffer,(int32_t)sVar1);
    }
    l = pCVar2->next;
    if ((delim != (char *)0x0) && (l != (_CharList *)0x0)) {
      uStack_440 = (code *)0x1f0628;
      sVar1 = strlen(delim);
      uStack_440 = (code *)0x1f0635;
      T_FileStream_write(s,delim,(int32_t)sVar1);
      l = pCVar2->next;
    }
  } while( true );
}

Assistant:

const char *pkg_writeCharList(FileStream *s, CharList *l, const char *delim, int32_t quote)
{
    char buffer[1024];
    while(l != NULL)
    {
        if(l->str)
        {
            uprv_strncpy(buffer, l->str, 1023);
            buffer[1023]=0;
            if(uprv_strlen(l->str) >= 1023)
            {
                fprintf(stderr, "%s:%d: Internal error, line too long (greater than 1023 chars)\n",
                        __FILE__, __LINE__);
                exit(0);
            }
            if(quote < 0) { /* remove quotes */
                if(buffer[uprv_strlen(buffer)-1] == '"') {
                    buffer[uprv_strlen(buffer)-1] = '\0';
                }
                if(buffer[0] == '"') {
                    uprv_strcpy(buffer, buffer+1);
                }
            } else if(quote > 0) { /* add quotes */
                if(l->str[0] != '"') {
                    uprv_strcpy(buffer, "\"");
                    uprv_strcat(buffer, l->str);
                }
                if(l->str[uprv_strlen(l->str)-1] != '"') {
                    uprv_strcat(buffer, "\"");
                }
            }
            T_FileStream_write(s, buffer, (int32_t)uprv_strlen(buffer));
        }

        if(l->next && delim)
        {
            T_FileStream_write(s, delim, (int32_t)uprv_strlen(delim));
        }
        l = l->next;
    }
    return NULL;
}